

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node>
embree::SceneGraph::createGarbageTriangleMesh
          (int hash,size_t numTriangles,bool mblur,Ref<embree::SceneGraph::MaterialNode> *material)

{
  int iVar1;
  undefined8 uVar2;
  ulong uVar3;
  uint uVar4;
  _func_int **pp_Var5;
  reference pvVar6;
  reference pvVar7;
  unsigned_long *puVar8;
  Vec3fa *pVVar9;
  byte in_CL;
  ulong in_RDX;
  int in_ESI;
  Node *in_RDI;
  long *in_R8;
  float w_1;
  float z_1;
  float y_1;
  float x_1;
  size_t i_10;
  float w;
  float z;
  float y;
  float x;
  size_t i_5;
  uint v2;
  uint v1;
  uint v0;
  size_t i;
  Ref<embree::SceneGraph::TriangleMeshNode> mesh;
  RandomSampler sampler;
  uint hash_1;
  anon_union_4_2_947300a4 v_7;
  anon_union_4_2_947300a4 v_6;
  anon_union_4_2_947300a4 v_5;
  anon_union_4_2_947300a4 v_4;
  anon_union_4_2_947300a4 v_3;
  anon_union_4_2_947300a4 v_2;
  anon_union_4_2_947300a4 v_1;
  anon_union_4_2_947300a4 v;
  uint n;
  uint m;
  uint r2;
  uint r1;
  uint c2;
  uint c1;
  uint n_2;
  uint m_2;
  uint n_4;
  uint m_4;
  uint n_6;
  uint m_6;
  uint n_7;
  uint m_7;
  uint n_8;
  uint m_8;
  uint n_9;
  uint m_9;
  uint n_10;
  uint m_10;
  uint n_11;
  uint m_11;
  uint n_12;
  uint m_12;
  uint n_13;
  uint m_13;
  uint n_14;
  uint m_14;
  uint n_1;
  uint m_1;
  uint n_3;
  uint m_3;
  uint n_5;
  uint m_5;
  size_t i_4;
  size_t i_3;
  Vec3fa *old_items;
  size_t i_2;
  size_t i_1;
  size_t i_9;
  size_t i_8;
  Vec3fa *old_items_1;
  size_t i_7;
  size_t i_6;
  size_t new_size_alloced;
  size_t new_size_alloced_1;
  void *in_stack_fffffffffffff8d8;
  size_t in_stack_fffffffffffff8e0;
  size_t in_stack_fffffffffffff8e8;
  undefined4 in_stack_fffffffffffff8f8;
  undefined4 in_stack_fffffffffffff8fc;
  undefined4 in_stack_fffffffffffff900;
  undefined4 in_stack_fffffffffffff904;
  undefined4 in_stack_fffffffffffff968;
  undefined4 in_stack_fffffffffffff96c;
  undefined4 in_stack_fffffffffffff970;
  undefined4 in_stack_fffffffffffff974;
  TriangleMeshNode *in_stack_fffffffffffff978;
  BBox1f in_stack_fffffffffffff980;
  uint local_63c;
  uint local_630;
  uint local_624;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  uint local_5b0;
  uint local_5ac;
  uint local_5a8;
  uint local_5a4;
  ulong local_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  uint local_578;
  uint local_574;
  uint local_570;
  uint local_56c;
  ulong local_568;
  Triangle local_560;
  uint local_554;
  uint local_550;
  uint local_54c;
  ulong local_548;
  undefined1 local_53d;
  undefined4 local_53c;
  undefined4 local_538;
  undefined4 local_534;
  undefined4 uStack_530;
  long *local_520;
  _func_int **local_518;
  uint local_50c [4];
  byte local_4f9;
  ulong local_4f8;
  long **local_4d8;
  undefined4 *local_4d0;
  undefined4 *local_4c8;
  undefined4 *local_4c0;
  _func_int **local_4b8;
  _func_int ***local_4b0;
  long **local_4a8;
  _func_int ***local_498;
  _func_int ***local_490;
  _func_int ***local_488;
  _func_int ***local_480;
  _func_int ***local_478;
  _func_int ***local_470;
  ulong local_468;
  reference local_460;
  ulong local_458;
  reference local_450;
  ulong local_448;
  reference local_440;
  ulong local_438;
  reference local_430;
  _func_int ***local_428;
  _func_int ***local_418;
  undefined8 *local_408;
  Vec3fa *local_400;
  undefined8 *local_3f8;
  Vec3fa *local_3f0;
  undefined8 *local_3e8;
  undefined8 *local_3e0;
  undefined8 *local_3d8;
  undefined8 *local_3d0;
  uint local_3c8;
  uint *local_3c0;
  uint *local_3b8;
  uint *local_3b0;
  uint *local_3a8;
  uint *local_3a0;
  uint *local_398;
  uint *local_390;
  uint *local_388;
  uint *local_380;
  uint *local_378;
  uint *local_370;
  uint *local_368;
  uint *local_360;
  uint *local_358;
  uint *local_350;
  uint local_348;
  uint local_344;
  uint local_340;
  uint local_33c;
  uint local_338;
  uint local_334;
  uint local_330;
  uint local_32c;
  uint local_328;
  uint local_324;
  uint local_320;
  uint local_31c;
  uint local_318;
  uint local_314;
  uint local_310;
  uint local_30c;
  uint local_308;
  uint local_304;
  uint local_300;
  uint local_2fc;
  undefined8 *local_2f8;
  uint local_2f0;
  uint local_2ec;
  uint local_2e8;
  uint local_2e4;
  undefined8 *local_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 *local_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 *local_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  uint local_288;
  uint local_284;
  uint local_280;
  uint local_27c;
  undefined8 local_278;
  undefined8 uStack_270;
  uint local_25c;
  uint local_258;
  uint local_254;
  uint local_250;
  undefined4 local_24c;
  undefined4 local_248;
  undefined4 local_244;
  undefined4 local_240;
  undefined4 local_23c;
  undefined4 local_238;
  uint local_234;
  uint local_230;
  uint local_22c;
  undefined4 local_228;
  undefined4 local_224;
  uint local_220;
  undefined4 local_21c;
  undefined4 local_218;
  uint local_214;
  undefined4 local_210;
  undefined4 local_20c;
  uint local_208;
  undefined4 local_204;
  undefined4 local_200;
  uint local_1fc;
  undefined4 local_1f8;
  undefined4 local_1f4;
  int local_1f0;
  undefined4 local_1ec;
  undefined4 local_1e8;
  int local_1e4;
  undefined4 local_1e0;
  undefined4 local_1dc;
  int local_1d8;
  undefined4 local_1d4;
  undefined4 local_1d0;
  uint local_1cc;
  undefined4 local_1c8;
  undefined4 local_1c4;
  int local_1c0;
  undefined4 local_1bc;
  undefined4 local_1b8;
  int local_1b4;
  undefined4 local_1b0;
  undefined4 local_1ac;
  int local_1a8;
  undefined4 local_1a4;
  undefined4 local_1a0;
  uint local_19c;
  undefined4 local_198;
  undefined4 local_194;
  uint local_190;
  undefined4 local_18c;
  undefined4 local_188;
  uint local_184;
  ulong local_180;
  ulong local_178;
  Vec3fa *local_170;
  ulong local_168;
  ulong local_160;
  size_t local_158;
  ulong local_150;
  reference local_148;
  Vec3fa *local_140;
  Vec3fa *local_138;
  Vec3fa *local_130;
  Vec3fa *local_128;
  size_t local_120;
  Vec3fa *local_118;
  reference local_110;
  size_t local_108;
  reference local_100;
  ulong local_f8;
  ulong local_f0;
  Vec3fa *local_e8;
  ulong local_e0;
  ulong local_d8;
  size_t local_d0;
  ulong local_c8;
  reference local_c0;
  Vec3fa *local_b8;
  Vec3fa *local_b0;
  Vec3fa *local_a8;
  Vec3fa *local_a0;
  size_t local_98;
  Vec3fa *local_90;
  reference local_88;
  size_t local_80;
  reference local_78;
  unsigned_long local_70 [2];
  ulong local_60;
  ulong local_58;
  reference local_50;
  size_t local_48;
  unsigned_long local_40 [2];
  ulong local_30;
  ulong local_28;
  reference local_20;
  size_t local_18;
  _func_int **local_10;
  
  local_4f9 = in_CL & 1;
  local_3c0 = local_50c;
  local_238 = 0xcc9e2d51;
  local_23c = 0x1b873593;
  local_240 = 0xf;
  local_244 = 0xd;
  local_248 = 5;
  local_24c = 0xe6546b64;
  uVar4 = in_ESI * 0x16a88000 | (uint)(in_ESI * -0x3361d2af) >> 0x11;
  local_234 = uVar4 * 0x1b873593;
  local_230 = (uVar4 * -0x194da000 | local_234 >> 0x13) * 5 + 0xe6546b64;
  uVar4 = (local_230 >> 0x10 ^ local_230) * -0x7a143595;
  local_3c8 = (uVar4 >> 0xd ^ uVar4) * -0x3d4d51cb;
  local_3c8 = local_3c8 >> 0x10 ^ local_3c8;
  local_4f8 = in_RDX;
  local_22c = local_3c8;
  local_50c[0] = local_3c8;
  pp_Var5 = (_func_int **)::operator_new(0xd8);
  local_53d = 1;
  local_4d8 = &local_520;
  local_520 = (long *)*in_R8;
  if (local_520 != (long *)0x0) {
    (**(code **)(*local_520 + 0x10))();
  }
  local_538 = 0;
  local_53c = 0x3f800000;
  local_4c0 = &local_534;
  local_4c8 = &local_538;
  local_4d0 = &local_53c;
  local_534 = 0;
  uStack_530 = 0x3f800000;
  TriangleMeshNode::TriangleMeshNode
            (in_stack_fffffffffffff978,
             (Ref<embree::SceneGraph::MaterialNode> *)
             CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),in_stack_fffffffffffff980
             ,CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
  local_53d = 0;
  local_4b0 = &local_518;
  local_4b8 = pp_Var5;
  local_518 = pp_Var5;
  if (pp_Var5 != (_func_int **)0x0) {
    (**(code **)(*pp_Var5 + 0x10))();
  }
  local_4a8 = &local_520;
  if (local_520 != (long *)0x0) {
    (**(code **)(*local_520 + 0x18))();
  }
  local_470 = &local_518;
  std::
  vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
  ::resize((vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
            *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
           CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
  for (local_548 = 0; local_548 < local_4f8; local_548 = local_548 + 1) {
    local_3a8 = local_50c;
    local_19c = local_50c[0];
    local_1a0 = 0x19660d;
    local_1a4 = 0x3c6ef35f;
    uVar4 = local_50c[0] * 0x19660d + 0x3c6ef35f;
    iVar1 = (int)local_548;
    if ((local_50c[0] >> 1) % 0x20 == 0) {
      local_350 = local_50c;
      local_224 = 0x19660d;
      local_228 = 0x3c6ef35f;
      local_624 = local_50c[0];
      local_220 = uVar4;
      local_50c[0] = uVar4 * 0x19660d + 0x3c6ef35f;
    }
    else {
      local_624 = iVar1 * 3;
      local_50c[0] = uVar4;
    }
    local_54c = local_624;
    local_3b0 = local_50c;
    local_190 = local_50c[0];
    local_194 = 0x19660d;
    local_198 = 0x3c6ef35f;
    uVar4 = local_50c[0] * 0x19660d + 0x3c6ef35f;
    if ((local_50c[0] >> 1) % 0x20 == 0) {
      local_358 = local_50c;
      local_218 = 0x19660d;
      local_21c = 0x3c6ef35f;
      local_630 = local_50c[0];
      local_214 = uVar4;
      local_50c[0] = uVar4 * 0x19660d + 0x3c6ef35f;
    }
    else {
      local_630 = iVar1 * 3 + 1;
      local_50c[0] = uVar4;
    }
    local_550 = local_630;
    local_3b8 = local_50c;
    local_184 = local_50c[0];
    local_188 = 0x19660d;
    local_18c = 0x3c6ef35f;
    uVar4 = local_50c[0] * 0x19660d + 0x3c6ef35f;
    if ((local_50c[0] >> 1) % 0x20 == 0) {
      local_360 = local_50c;
      local_20c = 0x19660d;
      local_210 = 0x3c6ef35f;
      local_63c = local_50c[0];
      local_208 = uVar4;
      local_50c[0] = uVar4 * 0x19660d + 0x3c6ef35f;
    }
    else {
      local_63c = iVar1 * 3 + 2;
      local_50c[0] = uVar4;
    }
    local_554 = local_63c;
    TriangleMeshNode::Triangle::Triangle(&local_560,local_624,local_630,local_63c);
    local_478 = &local_518;
    pvVar6 = std::
             vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
             ::operator[]((vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                           *)(local_518 + 0x17),local_548);
    pvVar6->v0 = local_560.v0;
    pvVar6->v1 = local_560.v1;
    pvVar6->v2 = local_560.v2;
  }
  local_480 = &local_518;
  pvVar7 = std::
           vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                         *)(local_518 + 0xe),0);
  local_150 = local_4f8 * 3;
  local_458 = local_150;
  local_450 = pvVar7;
  local_58 = local_150;
  local_50 = pvVar7;
  if (pvVar7->size_alloced < local_150) {
    local_48 = local_150;
    if (pvVar7->size_alloced != 0) {
      local_60 = pvVar7->size_alloced;
      while (local_60 < local_58) {
        local_70[1] = 1;
        local_70[0] = local_60 << 1;
        puVar8 = std::max<unsigned_long>(local_70 + 1,local_70);
        local_60 = *puVar8;
      }
      local_48 = local_60;
    }
  }
  else {
    local_48 = pvVar7->size_alloced;
  }
  local_158 = local_48;
  uVar3 = local_150;
  if (local_150 < pvVar7->size_active) {
    while (local_160 = uVar3, local_160 < pvVar7->size_active) {
      uVar3 = local_160 + 1;
    }
    pvVar7->size_active = local_150;
  }
  local_148 = pvVar7;
  if (local_48 == pvVar7->size_alloced) {
    for (local_168 = pvVar7->size_active; local_168 < local_150; local_168 = local_168 + 1) {
      local_140 = pvVar7->items + local_168;
    }
    pvVar7->size_active = local_150;
  }
  else {
    local_170 = pvVar7->items;
    local_108 = local_48;
    local_100 = pvVar7;
    pVVar9 = (Vec3fa *)alignedMalloc(in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0);
    pvVar7->items = pVVar9;
    for (local_178 = 0; local_178 < pvVar7->size_active; local_178 = local_178 + 1) {
      local_128 = pvVar7->items + local_178;
      local_130 = local_170 + local_178;
      uVar2 = *(undefined8 *)((long)&local_130->field_0 + 8);
      *(undefined8 *)&local_128->field_0 = *(undefined8 *)&local_130->field_0;
      *(undefined8 *)((long)&local_128->field_0 + 8) = uVar2;
    }
    for (local_180 = pvVar7->size_active; local_180 < local_150; local_180 = local_180 + 1) {
      local_138 = pvVar7->items + local_180;
    }
    local_120 = pvVar7->size_alloced;
    local_118 = local_170;
    local_110 = pvVar7;
    alignedFree(in_stack_fffffffffffff8d8);
    pvVar7->size_active = local_150;
    pvVar7->size_alloced = local_158;
  }
  for (local_568 = 0; local_568 < local_4f8 * 3; local_568 = local_568 + 1) {
    local_368 = local_50c;
    local_1fc = local_50c[0];
    local_200 = 0x19660d;
    local_204 = 0x3c6ef35f;
    local_1f0 = local_50c[0] * 0x19660d + 0x3c6ef35f;
    local_56c = local_50c[0];
    local_370 = local_50c;
    local_1f4 = 0x19660d;
    local_1f8 = 0x3c6ef35f;
    local_1e4 = local_1f0 * 0x19660d + 0x3c6ef35f;
    local_570 = local_50c[0];
    local_378 = local_50c;
    local_1e8 = 0x19660d;
    local_1ec = 0x3c6ef35f;
    local_1d8 = local_1e4 * 0x19660d + 0x3c6ef35f;
    local_574 = local_50c[0];
    local_380 = local_50c;
    local_1dc = 0x19660d;
    local_1e0 = 0x3c6ef35f;
    local_578 = local_50c[0];
    local_2f8 = &local_598;
    local_2d8 = CONCAT44(local_50c[0],local_50c[0]);
    uStack_2d0 = CONCAT44(local_50c[0],local_50c[0]);
    local_3d0 = &local_588;
    local_3d8 = &local_598;
    local_2c0 = &local_588;
    local_488 = &local_518;
    local_328 = local_578;
    local_324 = local_578;
    local_320 = local_574;
    local_31c = local_574;
    local_318 = local_570;
    local_314 = local_570;
    local_310 = local_56c;
    local_30c = local_56c;
    local_308 = local_578;
    local_304 = local_574;
    local_300 = local_570;
    local_2fc = local_56c;
    local_278 = local_2d8;
    uStack_270 = uStack_2d0;
    local_25c = local_56c;
    local_258 = local_570;
    local_254 = local_574;
    local_250 = local_578;
    local_598 = local_2d8;
    uStack_590 = uStack_2d0;
    local_588 = local_2d8;
    uStack_580 = uStack_2d0;
    local_50c[0] = local_1d8 * 0x19660d + 0x3c6ef35f;
    local_430 = std::
                vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                              *)(local_518 + 0xe),0);
    local_438 = local_568;
    local_3f0 = local_430->items + local_568;
    local_3f8 = &local_588;
    *(undefined8 *)&local_3f0->field_0 = local_588;
    *(undefined8 *)((long)&local_3f0->field_0 + 8) = uStack_580;
  }
  if ((local_4f9 & 1) != 0) {
    local_490 = &local_518;
    pvVar7 = std::
             vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
             ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                           *)(local_518 + 0xe),1);
    local_c8 = local_4f8 * 3;
    local_468 = local_c8;
    local_460 = pvVar7;
    local_28 = local_c8;
    local_20 = pvVar7;
    if (pvVar7->size_alloced < local_c8) {
      local_18 = local_c8;
      if (pvVar7->size_alloced != 0) {
        local_30 = pvVar7->size_alloced;
        while (local_30 < local_28) {
          local_40[1] = 1;
          local_40[0] = local_30 << 1;
          puVar8 = std::max<unsigned_long>(local_40 + 1,local_40);
          local_30 = *puVar8;
        }
        local_18 = local_30;
      }
    }
    else {
      local_18 = pvVar7->size_alloced;
    }
    local_d0 = local_18;
    uVar3 = local_c8;
    if (local_c8 < pvVar7->size_active) {
      while (local_d8 = uVar3, local_d8 < pvVar7->size_active) {
        uVar3 = local_d8 + 1;
      }
      pvVar7->size_active = local_c8;
    }
    local_c0 = pvVar7;
    if (local_18 == pvVar7->size_alloced) {
      for (local_e0 = pvVar7->size_active; local_e0 < local_c8; local_e0 = local_e0 + 1) {
        local_b8 = pvVar7->items + local_e0;
      }
      pvVar7->size_active = local_c8;
    }
    else {
      local_e8 = pvVar7->items;
      local_80 = local_18;
      local_78 = pvVar7;
      pVVar9 = (Vec3fa *)alignedMalloc(in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0);
      pvVar7->items = pVVar9;
      for (local_f0 = 0; local_f0 < pvVar7->size_active; local_f0 = local_f0 + 1) {
        local_a0 = pvVar7->items + local_f0;
        local_a8 = local_e8 + local_f0;
        uVar2 = *(undefined8 *)((long)&local_a8->field_0 + 8);
        *(undefined8 *)&local_a0->field_0 = *(undefined8 *)&local_a8->field_0;
        *(undefined8 *)((long)&local_a0->field_0 + 8) = uVar2;
      }
      for (local_f8 = pvVar7->size_active; local_f8 < local_c8; local_f8 = local_f8 + 1) {
        local_b0 = pvVar7->items + local_f8;
      }
      local_98 = pvVar7->size_alloced;
      local_90 = local_e8;
      local_88 = pvVar7;
      alignedFree(in_stack_fffffffffffff8d8);
      pvVar7->size_active = local_c8;
      pvVar7->size_alloced = local_d0;
    }
    for (local_5a0 = 0; local_5a0 < local_4f8 * 3; local_5a0 = local_5a0 + 1) {
      local_388 = local_50c;
      local_1cc = local_50c[0];
      local_1d0 = 0x19660d;
      local_1d4 = 0x3c6ef35f;
      local_1c0 = local_50c[0] * 0x19660d + 0x3c6ef35f;
      local_5a4 = local_50c[0];
      local_390 = local_50c;
      local_1c4 = 0x19660d;
      local_1c8 = 0x3c6ef35f;
      local_1b4 = local_1c0 * 0x19660d + 0x3c6ef35f;
      local_5a8 = local_50c[0];
      local_398 = local_50c;
      local_1b8 = 0x19660d;
      local_1bc = 0x3c6ef35f;
      local_1a8 = local_1b4 * 0x19660d + 0x3c6ef35f;
      local_5ac = local_50c[0];
      local_3a0 = local_50c;
      local_1ac = 0x19660d;
      local_1b0 = 0x3c6ef35f;
      local_5b0 = local_50c[0];
      local_2e0 = &local_5d8;
      local_2b8 = CONCAT44(local_50c[0],local_50c[0]);
      uStack_2b0 = CONCAT44(local_50c[0],local_50c[0]);
      local_3e0 = &local_5c8;
      local_3e8 = &local_5d8;
      local_2a0 = &local_5c8;
      local_498 = &local_518;
      local_348 = local_5b0;
      local_344 = local_5b0;
      local_340 = local_5ac;
      local_33c = local_5ac;
      local_338 = local_5a8;
      local_334 = local_5a8;
      local_330 = local_5a4;
      local_32c = local_5a4;
      local_2f0 = local_5b0;
      local_2ec = local_5ac;
      local_2e8 = local_5a8;
      local_2e4 = local_5a4;
      local_298 = local_2b8;
      uStack_290 = uStack_2b0;
      local_288 = local_5a4;
      local_284 = local_5a8;
      local_280 = local_5ac;
      local_27c = local_5b0;
      local_5d8 = local_2b8;
      uStack_5d0 = uStack_2b0;
      local_5c8 = local_2b8;
      uStack_5c0 = uStack_2b0;
      local_50c[0] = local_1a8 * 0x19660d + 0x3c6ef35f;
      local_440 = std::
                  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                  ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                *)(local_518 + 0xe),1);
      local_448 = local_5a0;
      local_400 = local_440->items + local_5a0;
      local_408 = &local_5c8;
      *(undefined8 *)&local_400->field_0 = local_5c8;
      *(undefined8 *)((long)&local_400->field_0 + 8) = uStack_5c0;
    }
  }
  local_428 = &local_518;
  local_10 = local_518;
  (in_RDI->super_RefCount)._vptr_RefCount = local_518;
  if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
  }
  local_418 = &local_518;
  if (local_518 != (_func_int **)0x0) {
    (**(code **)(*local_518 + 0x18))();
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createGarbageTriangleMesh (int hash, size_t numTriangles, bool mblur, Ref<MaterialNode> material)
  {
    RandomSampler sampler;
    RandomSampler_init(sampler,hash);
    Ref<SceneGraph::TriangleMeshNode> mesh = new SceneGraph::TriangleMeshNode(material,BBox1f(0,1),mblur?2:1);

    mesh->triangles.resize(numTriangles);
    for (size_t i=0; i<numTriangles; i++) {
      const unsigned v0 = (RandomSampler_getInt(sampler) % 32 == 0) ? RandomSampler_getUInt(sampler) : unsigned(3*i+0);
      const unsigned v1 = (RandomSampler_getInt(sampler) % 32 == 0) ? RandomSampler_getUInt(sampler) : unsigned(3*i+1);
      const unsigned v2 = (RandomSampler_getInt(sampler) % 32 == 0) ? RandomSampler_getUInt(sampler) : unsigned(3*i+2);
      mesh->triangles[i] = TriangleMeshNode::Triangle(v0,v1,v2);
    }

    mesh->positions[0].resize(3*numTriangles);
    for (size_t i=0; i<3*numTriangles; i++) {
      const float x = cast_i2f(RandomSampler_getUInt(sampler));
      const float y = cast_i2f(RandomSampler_getUInt(sampler));
      const float z = cast_i2f(RandomSampler_getUInt(sampler));
      const float w = cast_i2f(RandomSampler_getUInt(sampler));
      mesh->positions[0][i] = Vec3ff(x,y,z,w);
    }

    if (mblur) 
    {
      mesh->positions[1].resize(3*numTriangles);
      for (size_t i=0; i<3*numTriangles; i++) {
        const float x = cast_i2f(RandomSampler_getUInt(sampler));
        const float y = cast_i2f(RandomSampler_getUInt(sampler));
        const float z = cast_i2f(RandomSampler_getUInt(sampler));
        const float w = cast_i2f(RandomSampler_getUInt(sampler));
        mesh->positions[1][i] = Vec3ff(x,y,z,w);
      }
    }

    return mesh.dynamicCast<SceneGraph::Node>();
  }